

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O3

target_ulong
helper_precrqu_s_ob_qh_mips64(target_ulong rs,target_ulong rt,CPUMIPSState_conflict5 *env)

{
  uint uVar1;
  ulong uVar2;
  ushort uVar3;
  long lVar4;
  byte *pbVar5;
  uint8_t temp [8];
  
  if ((long)rs < 0) {
    pbVar5 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar5 = *pbVar5 | 0x40;
    temp[7] = '\0';
  }
  else if (rs < 0x7f81000000000000) {
    temp[7] = (uint8_t)(rs >> 0x37);
  }
  else {
    pbVar5 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar5 = *pbVar5 | 0x40;
    temp[7] = 0xff;
  }
  if ((short)(rs >> 0x20) < 0) {
    pbVar5 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar5 = *pbVar5 | 0x40;
    temp[6] = '\0';
  }
  else {
    uVar1 = (uint)(rs >> 0x20);
    if ((uVar1 & 0xffff) < 0x7f81) {
      temp[6] = (uint8_t)(uVar1 >> 7);
    }
    else {
      pbVar5 = (byte *)((long)&(env->active_tc).DSPControl + 2);
      *pbVar5 = *pbVar5 | 0x40;
      temp[6] = 0xff;
    }
  }
  uVar3 = (ushort)(rs >> 0x10);
  if ((short)uVar3 < 0) {
    pbVar5 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar5 = *pbVar5 | 0x40;
    temp[5] = '\0';
  }
  else if (uVar3 < 0x7f81) {
    temp[5] = (uint8_t)(rs >> 0x17);
  }
  else {
    pbVar5 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar5 = *pbVar5 | 0x40;
    temp[5] = 0xff;
  }
  if ((short)rs < 0) {
    pbVar5 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar5 = *pbVar5 | 0x40;
    temp[4] = '\0';
  }
  else if (((uint)rs & 0xffff) < 0x7f81) {
    temp[4] = (uint8_t)(rs >> 7);
  }
  else {
    pbVar5 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar5 = *pbVar5 | 0x40;
    temp[4] = 0xff;
  }
  uVar1 = (uint)(rt >> 0x20);
  if ((long)rt < 0) {
    pbVar5 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar5 = *pbVar5 | 0x40;
    temp[3] = '\0';
  }
  else if (rt < 0x7f81000000000000) {
    temp[3] = (uint8_t)(uVar1 >> 0x17);
  }
  else {
    pbVar5 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar5 = *pbVar5 | 0x40;
    temp[3] = 0xff;
  }
  if ((short)(rt >> 0x20) < 0) {
    pbVar5 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar5 = *pbVar5 | 0x40;
    temp[2] = '\0';
  }
  else if ((uVar1 & 0xffff) < 0x7f81) {
    temp[2] = (uint8_t)(uVar1 >> 7);
  }
  else {
    pbVar5 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar5 = *pbVar5 | 0x40;
    temp[2] = 0xff;
  }
  if ((short)(rt >> 0x10) < 0) {
    pbVar5 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar5 = *pbVar5 | 0x40;
    temp[1] = '\0';
  }
  else if (((uint)(rt >> 0x10) & 0xffff) < 0x7f81) {
    temp[1] = (uint8_t)(rt >> 0x17);
  }
  else {
    pbVar5 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar5 = *pbVar5 | 0x40;
    temp[1] = 0xff;
  }
  if ((short)rt < 0) {
    pbVar5 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar5 = *pbVar5 | 0x40;
    temp[0] = '\0';
  }
  else if (((uint)rt & 0xffff) < 0x7f81) {
    temp[0] = (uint8_t)(rt >> 7);
  }
  else {
    pbVar5 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar5 = *pbVar5 | 0x40;
    temp[0] = 0xff;
  }
  pbVar5 = temp;
  lVar4 = 0;
  uVar2 = 0;
  do {
    uVar2 = uVar2 | (ulong)*pbVar5 << ((byte)lVar4 & 0x3f);
    pbVar5 = pbVar5 + 1;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x40);
  return uVar2;
}

Assistant:

target_ulong helper_precrqu_s_ob_qh(target_ulong rs, target_ulong rt,
                                    CPUMIPSState *env)
{
    int i;
    uint16_t rs3, rs2, rs1, rs0;
    uint16_t rt3, rt2, rt1, rt0;
    uint8_t temp[8];
    uint64_t result;

    result = 0;

    MIPSDSP_SPLIT64_16(rs, rs3, rs2, rs1, rs0);
    MIPSDSP_SPLIT64_16(rt, rt3, rt2, rt1, rt0);

    temp[7] = mipsdsp_sat8_reduce_precision(rs3, env);
    temp[6] = mipsdsp_sat8_reduce_precision(rs2, env);
    temp[5] = mipsdsp_sat8_reduce_precision(rs1, env);
    temp[4] = mipsdsp_sat8_reduce_precision(rs0, env);
    temp[3] = mipsdsp_sat8_reduce_precision(rt3, env);
    temp[2] = mipsdsp_sat8_reduce_precision(rt2, env);
    temp[1] = mipsdsp_sat8_reduce_precision(rt1, env);
    temp[0] = mipsdsp_sat8_reduce_precision(rt0, env);

    for (i = 0; i < 8; i++) {
        result |= (uint64_t)temp[i] << (8 * i);
    }

    return result;
}